

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.h
# Opt level: O1

CBoundary * __thiscall CLayer::GetBoundary(CLayer *this,int iX1,int iY1,int iX2,int iY2)

{
  int iVar1;
  CGrid *pCVar2;
  ulong uVar3;
  
  if (iY1 == iY2 && iX1 == iX2) {
    return (CBoundary *)0x0;
  }
  iVar1 = IsHorizontal(this);
  if ((iY1 - iY2 == 0) && (iVar1 != 0)) {
    if (((iX1 - iX2) + 1U & 0xfffffffd) != 0) {
      __assert_fail("abs(iX1-iX2)==1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.h"
                    ,0xaf,"CBoundary *CLayer::GetBoundary(int, int, int, int)");
    }
    uVar3 = (ulong)(uint)iX2;
    if (iX1 < iX2) {
      uVar3 = (ulong)(uint)iX1;
    }
    if ((int)((uint)uVar3 | iY1) < 0) {
      return (CBoundary *)0x0;
    }
    if (this->m_iMaxBX <= (int)(uint)uVar3) {
      return (CBoundary *)0x0;
    }
  }
  else {
    iVar1 = IsVertical(this);
    if (iX1 != iX2) {
      return (CBoundary *)0x0;
    }
    if (iVar1 == 0) {
      return (CBoundary *)0x0;
    }
    if (((iY1 - iY2) + 1U & 0xfffffffd) != 0) {
      __assert_fail("abs(iY1-iY2)==1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.h"
                    ,0xb4,"CBoundary *CLayer::GetBoundary(int, int, int, int)");
    }
    if (iY2 <= iY1) {
      iY1 = iY2;
    }
    if ((iY1 | iX1) < 0) {
      return (CBoundary *)0x0;
    }
    if (this->m_iMaxBX <= iX1) {
      return (CBoundary *)0x0;
    }
    uVar3 = (ulong)(uint)iX1;
  }
  pCVar2 = (CGrid *)0x0;
  if (iY1 < this->m_iMaxBY) {
    pCVar2 = this->m_ppGrid[uVar3] + (uint)iY1;
  }
  return &pCVar2->super_CBoundary;
}

Assistant:

inline CBoundary* CLayer::GetBoundary(int iX1, int iY1, int iX2, int iY2)
{
	if(iX1==iX2&&iY1==iY2)	return	NULL;

	if(IsHorizontal()&&iY1==iY2)
	{
		assert(abs(iX1-iX2)==1);
		return	GetBoundary(MIN(iX1,iX2),iY1);
	}
	else if(IsVertical()&&iX1==iX2)
	{
		assert(abs(iY1-iY2)==1);
		return	GetBoundary(iX1,MIN(iY1,iY2));
	}

	return	NULL;
}